

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

void __thiscall FOTerm::print(FOTerm *this,ostream *o)

{
  ostream *poVar1;
  size_type sVar2;
  reference this_00;
  int local_1c;
  int i;
  ostream *o_local;
  FOTerm *this_local;
  
  if (this->tag == Variable) {
    std::operator<<(o,(string *)&this->name);
  }
  else if (this->tag == Functor) {
    poVar1 = std::operator<<(o,(string *)&this->name);
    std::operator<<(poVar1,"(");
    for (local_1c = 0; sVar2 = std::vector<FOTerm,_std::allocator<FOTerm>_>::size(&this->params),
        (ulong)(long)local_1c < sVar2; local_1c = local_1c + 1) {
      this_00 = std::vector<FOTerm,_std::allocator<FOTerm>_>::operator[]
                          (&this->params,(long)local_1c);
      print(this_00,o);
      sVar2 = std::vector<FOTerm,_std::allocator<FOTerm>_>::size(&this->params);
      if ((ulong)(long)(local_1c + 1) < sVar2) {
        std::operator<<(o,", ");
      }
    }
    std::operator<<(o,")");
  }
  return;
}

Assistant:

void print(std::ostream &o) {
        switch (tag) {
            case FOTermTag::Variable:
                o << name;
                return;
            case FOTermTag::Functor:
                o << name << "(";
                for (int i = 0; i < params.size(); ++i) {
                    params[i].print(o);
                    if (i + 1 < params.size()) o << ", ";
                }
                o << ")";
        }
    }